

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesShaderIntrinsicsBase.cpp
# Opt level: O0

string * vkt::sparse::getOpTypeImageSparse
                   (string *__return_storage_ptr__,ImageType imageType,TextureFormat *format,
                   string *componentType,bool requiresSampler)

{
  ostream *poVar1;
  ostringstream local_1a8 [8];
  ostringstream src;
  bool requiresSampler_local;
  string *componentType_local;
  TextureFormat *format_local;
  ImageType imageType_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar1 = std::operator<<((ostream *)local_1a8,"OpTypeImage ");
  poVar1 = std::operator<<(poVar1,(string *)componentType);
  std::operator<<(poVar1," ");
  switch(imageType) {
  case IMAGE_TYPE_1D:
    std::operator<<((ostream *)local_1a8,"1D 0 0 0 ");
    break;
  case IMAGE_TYPE_1D_ARRAY:
    std::operator<<((ostream *)local_1a8,"1D 0 1 0 ");
    break;
  case IMAGE_TYPE_2D:
    std::operator<<((ostream *)local_1a8,"2D 0 0 0 ");
    break;
  case IMAGE_TYPE_2D_ARRAY:
    std::operator<<((ostream *)local_1a8,"2D 0 1 0 ");
    break;
  case IMAGE_TYPE_3D:
    std::operator<<((ostream *)local_1a8,"3D 0 0 0 ");
    break;
  case IMAGE_TYPE_CUBE:
    std::operator<<((ostream *)local_1a8,"Cube 0 0 0 ");
    break;
  case IMAGE_TYPE_CUBE_ARRAY:
    std::operator<<((ostream *)local_1a8,"Cube 0 1 0 ");
  }
  if (requiresSampler) {
    std::operator<<((ostream *)local_1a8,"1 ");
  }
  else {
    std::operator<<((ostream *)local_1a8,"2 ");
  }
  switch(format->order) {
  case R:
    std::operator<<((ostream *)local_1a8,"R");
    break;
  default:
    break;
  case RG:
    std::operator<<((ostream *)local_1a8,"Rg");
    break;
  case RGB:
    std::operator<<((ostream *)local_1a8,"Rgb");
    break;
  case RGBA:
    std::operator<<((ostream *)local_1a8,"Rgba");
  }
  switch(format->type) {
  case SIGNED_INT8:
    std::operator<<((ostream *)local_1a8,"8i");
    break;
  case SIGNED_INT16:
    std::operator<<((ostream *)local_1a8,"16i");
    break;
  case SIGNED_INT32:
    std::operator<<((ostream *)local_1a8,"32i");
    break;
  case UNSIGNED_INT8:
    std::operator<<((ostream *)local_1a8,"8ui");
    break;
  case UNSIGNED_INT16:
    std::operator<<((ostream *)local_1a8,"16ui");
    break;
  default:
    break;
  case UNSIGNED_INT32:
    std::operator<<((ostream *)local_1a8,"32ui");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string getOpTypeImageSparse (const ImageType			imageType,
								  const tcu::TextureFormat&	format,
								  const std::string&		componentType,
								  const bool				requiresSampler)
{
	std::ostringstream	src;

	src << "OpTypeImage " << componentType << " ";

	switch (imageType)
	{
		case IMAGE_TYPE_1D :
			src << "1D 0 0 0 ";
		break;
		case IMAGE_TYPE_1D_ARRAY :
			src << "1D 0 1 0 ";
		break;
		case IMAGE_TYPE_2D :
			src << "2D 0 0 0 ";
		break;
		case IMAGE_TYPE_2D_ARRAY :
			src << "2D 0 1 0 ";
		break;
		case IMAGE_TYPE_3D :
			src << "3D 0 0 0 ";
		break;
		case IMAGE_TYPE_CUBE :
			src << "Cube 0 0 0 ";
		break;
		case IMAGE_TYPE_CUBE_ARRAY :
			src << "Cube 0 1 0 ";
		break;
		default :
			DE_ASSERT(0);
		break;
	};

	if (requiresSampler)
		src << "1 ";
	else
		src << "2 ";

	switch (format.order)
	{
		case tcu::TextureFormat::R:
			src << "R";
		break;
		case tcu::TextureFormat::RG:
			src << "Rg";
			break;
		case tcu::TextureFormat::RGB:
			src << "Rgb";
			break;
		case tcu::TextureFormat::RGBA:
			src << "Rgba";
		break;
		default:
			DE_ASSERT(0);
		break;
	}

	switch (format.type)
	{
		case tcu::TextureFormat::SIGNED_INT8:
			src << "8i";
		break;
		case tcu::TextureFormat::SIGNED_INT16:
			src << "16i";
		break;
		case tcu::TextureFormat::SIGNED_INT32:
			src << "32i";
		break;
		case tcu::TextureFormat::UNSIGNED_INT8:
			src << "8ui";
		break;
		case tcu::TextureFormat::UNSIGNED_INT16:
			src << "16ui";
		break;
		case tcu::TextureFormat::UNSIGNED_INT32:
			src << "32ui";
		break;
		default:
			DE_ASSERT(0);
		break;
	};

	return src.str();
}